

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalNinjaGenerator::GetTargetDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,cmTarget *target)

{
  allocator local_11;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"CMakeFiles/",&local_11);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator
::GetTargetDirectory(cmTarget const& target) const
{
  std::string dir = cmake::GetCMakeFilesDirectoryPostSlash();
  dir += target.GetName();
#if defined(__VMS)
  dir += "_dir";
#else
  dir += ".dir";
#endif
  return dir;
}